

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O1

Byte * __thiscall
CharStringType2Interpreter::InterpretNumber
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  _List_node_base *p_Var5;
  Byte *pBVar6;
  double dVar7;
  CharStringOperand operand;
  undefined1 local_28;
  undefined7 uStack_27;
  _List_node_base *p_Stack_20;
  
  if (inReadLimit < 1) {
    return (Byte *)0x0;
  }
  bVar2 = *inProgramCounter;
  if (inReadLimit < 3 || (ulong)bVar2 != 0x1c) {
    if ((byte)(bVar2 - 0x20) < 0xd7) {
      local_28 = 1;
      p_Stack_20 = (_List_node_base *)((ulong)bVar2 - 0x8b);
      pBVar6 = inProgramCounter + 1;
    }
    else {
      if ((bVar2 < 0xf7) || (inReadLimit == 1 || 0xfa < bVar2)) {
        if ((bVar2 < 0xfb) || (inReadLimit == 1 || bVar2 == 0xff)) {
          if (inReadLimit < 5 || bVar2 != 0xff) {
            pBVar6 = (Byte *)0x0;
          }
          else {
            local_28 = 0;
            uVar3 = *(ushort *)(inProgramCounter + 1) << 8 | *(ushort *)(inProgramCounter + 1) >> 8;
            dVar7 = (double)(ushort)(*(ushort *)(inProgramCounter + 3) << 8 |
                                    *(ushort *)(inProgramCounter + 3) >> 8) * 1.52587890625e-05;
            if ((short)uVar3 < 1) {
              dVar7 = -dVar7;
            }
            p_Stack_20 = (_List_node_base *)(dVar7 + (double)(int)(short)uVar3);
            pBVar6 = inProgramCounter + 5;
          }
          goto LAB_001a393a;
        }
        p_Stack_20 = (_List_node_base *)(0xfa94 - (ulong)CONCAT11(bVar2,inProgramCounter[1]));
      }
      else {
        p_Stack_20 = (_List_node_base *)
                     (((ulong)bVar2 * 0x100 + (ulong)inProgramCounter[1]) - 0xf694);
      }
      local_28 = 1;
      pBVar6 = inProgramCounter + 2;
    }
  }
  else {
    local_28 = 1;
    p_Stack_20 = (_List_node_base *)
                 ((long)(short)((ushort)inProgramCounter[1] << 8) | (ulong)inProgramCounter[2]);
    pBVar6 = inProgramCounter + 3;
  }
LAB_001a393a:
  if (pBVar6 == (Byte *)0x0) {
    return (Byte *)0x0;
  }
  p_Var5 = (_List_node_base *)operator_new(0x20);
  p_Var5[1]._M_next = (_List_node_base *)CONCAT71(uStack_27,local_28);
  p_Var5[1]._M_prev = p_Stack_20;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  iVar4 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[1])
                    (this->mImplementationHelper,&local_28);
  if (iVar4 != 0) {
    return (Byte *)0x0;
  }
  return pBVar6;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretNumber(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	CharStringOperand operand;
	Byte* newPosition = inProgramCounter;

	if(inReadLimit < 1)
		return NULL; // error, cant read a single byte

	if(28 == *newPosition && inReadLimit >= 3)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)(
									((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
		newPosition += 3;
	} 
	else if(32 <= *newPosition && *newPosition <= 246)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)*newPosition - 139;
		++newPosition;
	}
	else if(247 <= *newPosition && *newPosition <= 250  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (*newPosition - 247) * 256 + *(newPosition + 1) + 108;
		newPosition += 2;
	}
	else if(251 <= *newPosition && *newPosition <= 254  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = -(short)(*newPosition - 251) * 256 - *(newPosition + 1) - 108;
		newPosition += 2;
	}
	else if(255 == *newPosition  && inReadLimit >= 5)
	{
		operand.IsInteger = false;
		operand.RealValue = (short)(((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
			if(operand.RealValue > 0)
				operand.RealValue+=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
			else
				operand.RealValue-=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
		newPosition += 5;
	}
	else
		newPosition = NULL; // error

	if(newPosition)
	{
		mOperandStack.push_back(operand);
		EStatusCode status = mImplementationHelper->Type2InterpretNumber(operand);
		if(status != eSuccess)
			return NULL;

	}

	return newPosition;
}